

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_sender.c
# Opt level: O2

ASYNC_OPERATION_HANDLE
messagesender_send_async
          (MESSAGE_SENDER_HANDLE message_sender,MESSAGE_HANDLE message,
          ON_MESSAGE_SEND_COMPLETE on_message_send_complete,void *callback_context,
          tickcounter_ms_t timeout)

{
  size_t sVar1;
  SEND_ONE_MESSAGE_RESULT SVar2;
  LOGGER_LOG p_Var3;
  ASYNC_OPERATION_HANDLE async_operation;
  ulong uVar4;
  ASYNC_OPERATION_HANDLE *ppAVar5;
  MESSAGE_HANDLE pMVar6;
  int iVar7;
  ulong uVar8;
  char *pcVar9;
  bool bVar10;
  
  if (message_sender == (MESSAGE_SENDER_HANDLE)0x0 || message == (MESSAGE_HANDLE)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                ,"messagesender_send_async",899,1,
                "Bad parameters: message_sender=%p, message=%p, on_message_send_complete=%p, callback_context=%p, timeout=%lu"
                ,message_sender,message,on_message_send_complete,callback_context,timeout);
      return (ASYNC_OPERATION_HANDLE)0x0;
    }
  }
  else if (message_sender->message_sender_state == MESSAGE_SENDER_STATE_ERROR) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      pcVar9 = "Message sender in ERROR state";
      iVar7 = 0x38a;
LAB_0016a819:
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                ,"messagesender_send_async",iVar7,1,pcVar9);
      return (ASYNC_OPERATION_HANDLE)0x0;
    }
  }
  else {
    async_operation = async_operation_create(messagesender_send_cancel_handler,0x40);
    if (async_operation == (ASYNC_OPERATION_HANDLE)0x0) {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        pcVar9 = "Failed allocating context for send";
        iVar7 = 0x392;
        goto LAB_0016a819;
      }
    }
    else {
      uVar4 = message_sender->message_count + 1;
      uVar8 = 0xffffffffffffffff;
      if (uVar4 != 0) {
        uVar8 = uVar4;
      }
      if ((uVar8 >> 0x3d == 0) &&
         (ppAVar5 = (ASYNC_OPERATION_HANDLE *)realloc(message_sender->messages,uVar8 << 3),
         ppAVar5 != (ASYNC_OPERATION_HANDLE *)0x0)) {
        async_operation[6].async_operation_cancel_handler =
             (ASYNC_OPERATION_CANCEL_HANDLER_FUNC)timeout;
        message_sender->messages = ppAVar5;
        if (message_sender->message_sender_state == MESSAGE_SENDER_STATE_OPEN) {
          async_operation[1].async_operation_cancel_handler =
               (ASYNC_OPERATION_CANCEL_HANDLER_FUNC)0x0;
          *(undefined4 *)&async_operation[5].async_operation_cancel_handler = 1;
          bVar10 = true;
        }
        else {
          pMVar6 = message_clone(message);
          async_operation[1].async_operation_cancel_handler =
               (ASYNC_OPERATION_CANCEL_HANDLER_FUNC)pMVar6;
          if (pMVar6 == (MESSAGE_HANDLE)0x0) {
            p_Var3 = xlogging_get_log_function();
            if (p_Var3 != (LOGGER_LOG)0x0) {
              (*p_Var3)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                        ,"messagesender_send_async",0x3aa,1,
                        "Cannot clone message for placing it in the pending sends list");
            }
            async_operation_destroy(async_operation);
            *(undefined4 *)&async_operation[5].async_operation_cancel_handler = 0;
            return (ASYNC_OPERATION_HANDLE)0x0;
          }
          *(undefined4 *)&async_operation[5].async_operation_cancel_handler = 0;
          ppAVar5 = message_sender->messages;
          bVar10 = message_sender->message_sender_state == MESSAGE_SENDER_STATE_OPEN;
        }
        async_operation[2].async_operation_cancel_handler =
             (ASYNC_OPERATION_CANCEL_HANDLER_FUNC)on_message_send_complete;
        async_operation[3].async_operation_cancel_handler =
             (ASYNC_OPERATION_CANCEL_HANDLER_FUNC)callback_context;
        async_operation[4].async_operation_cancel_handler =
             (ASYNC_OPERATION_CANCEL_HANDLER_FUNC)message_sender;
        sVar1 = message_sender->message_count;
        ppAVar5[sVar1] = async_operation;
        message_sender->message_count = sVar1 + 1;
        if (!bVar10) {
          return async_operation;
        }
        SVar2 = send_one_message(message_sender,async_operation,message);
        if (SVar2 == SEND_ONE_MESSAGE_OK) {
          return async_operation;
        }
        if (SVar2 != SEND_ONE_MESSAGE_BUSY) {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                      ,"messagesender_send_async",0x3c6,1,"Error sending message");
          }
          remove_pending_message_by_index(message_sender,message_sender->message_count - 1);
          return (ASYNC_OPERATION_HANDLE)0x0;
        }
        pMVar6 = message_clone(message);
        async_operation[1].async_operation_cancel_handler =
             (ASYNC_OPERATION_CANCEL_HANDLER_FUNC)pMVar6;
        if (pMVar6 != (MESSAGE_HANDLE)0x0) {
          *(undefined4 *)&async_operation[5].async_operation_cancel_handler = 0;
          return async_operation;
        }
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                    ,"messagesender_send_async",0x3cf,1,
                    "Error cloning message for placing it in the pending sends list");
        }
      }
      else {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                    ,"messagesender_send_async",0x39d,1,
                    "Failed allocating memory for pending sends, size:%zu",
                    -(ulong)(uVar8 >> 0x3d != 0) | uVar8 << 3);
        }
      }
      async_operation_destroy(async_operation);
    }
  }
  return (ASYNC_OPERATION_HANDLE)0x0;
}

Assistant:

ASYNC_OPERATION_HANDLE messagesender_send_async(MESSAGE_SENDER_HANDLE message_sender, MESSAGE_HANDLE message, ON_MESSAGE_SEND_COMPLETE on_message_send_complete, void* callback_context, tickcounter_ms_t timeout)
{
    ASYNC_OPERATION_HANDLE result;

    if ((message_sender == NULL) ||
        (message == NULL))
    {
        LogError("Bad parameters: message_sender=%p, message=%p, on_message_send_complete=%p, callback_context=%p, timeout=%" PRIu64, message_sender, message, on_message_send_complete, callback_context, (uint64_t)timeout);
        result = NULL;
    }
    else
    {
        if (message_sender->message_sender_state == MESSAGE_SENDER_STATE_ERROR)
        {
            LogError("Message sender in ERROR state");
            result = NULL;
        }
        else
        {
            result = CREATE_ASYNC_OPERATION(MESSAGE_WITH_CALLBACK, messagesender_send_cancel_handler);
            if (result == NULL)
            {
                LogError("Failed allocating context for send");
            }
            else
            {
                ASYNC_OPERATION_HANDLE* new_messages;
                MESSAGE_WITH_CALLBACK* message_with_callback = GET_ASYNC_OPERATION_CONTEXT(MESSAGE_WITH_CALLBACK, result);
                size_t realloc_size = safe_add_size_t(message_sender->message_count, 1);
                realloc_size = safe_multiply_size_t(realloc_size, sizeof(ASYNC_OPERATION_HANDLE));
                if (realloc_size == SIZE_MAX ||
                    (new_messages = (ASYNC_OPERATION_HANDLE*)realloc(message_sender->messages, realloc_size)) == NULL)
                {
                    LogError("Failed allocating memory for pending sends, size:%zu", realloc_size);
                    async_operation_destroy(result);
                    result = NULL;
                }
                else
                {
                    message_with_callback->timeout = timeout;
                    message_sender->messages = new_messages;
                    if (message_sender->message_sender_state != MESSAGE_SENDER_STATE_OPEN)
                    {
                        message_with_callback->message = message_clone(message);
                        if (message_with_callback->message == NULL)
                        {
                            LogError("Cannot clone message for placing it in the pending sends list");
                            async_operation_destroy(result);
                            result = NULL;
                        }

                        message_with_callback->message_send_state = MESSAGE_SEND_STATE_NOT_SENT;
                    }
                    else
                    {
                        message_with_callback->message = NULL;
                        message_with_callback->message_send_state = MESSAGE_SEND_STATE_PENDING;
                    }

                    if (result != NULL)
                    {
                        message_with_callback->on_message_send_complete = on_message_send_complete;
                        message_with_callback->context = callback_context;
                        message_with_callback->message_sender = message_sender;

                        message_sender->messages[message_sender->message_count] = result;
                        message_sender->message_count++;

                        if (message_sender->message_sender_state == MESSAGE_SENDER_STATE_OPEN)
                        {
                            switch (send_one_message(message_sender, result, message))
                            {
                            default:
                            case SEND_ONE_MESSAGE_ERROR:
                                LogError("Error sending message");
                                remove_pending_message_by_index(message_sender, message_sender->message_count - 1);
                                result = NULL;
                                break;

                            case SEND_ONE_MESSAGE_BUSY:
                                message_with_callback->message = message_clone(message);
                                if (message_with_callback->message == NULL)
                                {
                                    LogError("Error cloning message for placing it in the pending sends list");
                                    async_operation_destroy(result);
                                    result = NULL;
                                }
                                else
                                {
                                    message_with_callback->message_send_state = MESSAGE_SEND_STATE_NOT_SENT;
                                }
                                break;

                            case SEND_ONE_MESSAGE_OK:
                                break;
                            }
                        }
                    }
                }
            }
        }
    }

    return result;
}